

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  initializer_list<int> __l;
  SwinTransformer<float> *pSVar1;
  ostream *this;
  undefined1 local_c8 [8];
  Tensor<float> output;
  undefined1 local_78 [8];
  Tensor<float> input;
  array<int,_4UL> local_38;
  SwinTransformer<float> *local_28;
  SwinTransformer<float> *swin_t;
  undefined4 local_c;
  
  local_c = 0;
  std::operator<<((ostream *)&std::cout,"Test Tiny Swin Transformer: ");
  std::ostream::flush();
  pSVar1 = (SwinTransformer<float> *)operator_new(0x1c8);
  local_38._M_elems[0] = 2;
  local_38._M_elems[1] = 2;
  local_38._M_elems[2] = 6;
  local_38._M_elems[3] = 2;
  input.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 3;
  input.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 6;
  shift_window_transformer::SwinTransformer<float>::SwinTransformer
            (pSVar1,0x60,&local_38,
             (array<int,_4UL> *)
             &input.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_28 = pSVar1;
  shift_window_transformer::Tensor<float>::Tensor((Tensor<float> *)local_78,0x24c00,0.0);
  output.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 3;
  __l._M_len = 3;
  __l._M_array = (iterator)
                 ((long)&output.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 4);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)
             &input.super_vector<float,_std::allocator<float>_>.
              super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,__l);
  shift_window_transformer::Tensor<float>::Tensor((Tensor<float> *)local_c8);
  (*(code *)**(undefined8 **)local_28)(local_28,local_78,local_c8);
  pSVar1 = local_28;
  if (local_28 != (SwinTransformer<float> *)0x0) {
    shift_window_transformer::SwinTransformer<float>::~SwinTransformer(local_28);
    operator_delete(pSVar1,0x1c8);
  }
  this = std::operator<<((ostream *)&std::cout,"Ok");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  shift_window_transformer::Tensor<float>::~Tensor((Tensor<float> *)local_c8);
  shift_window_transformer::Tensor<float>::~Tensor((Tensor<float> *)local_78);
  return 0;
}

Assistant:

int main() {
    /*
     * Test Swin Transformer
     */
    try {
        std::cout << "Test Tiny Swin Transformer: ";
        std::cout.flush();
        auto *swin_t = new shift_window_transformer::SwinTransformer<data_t>(
                96, std::array<int, 4>{2, 2, 6, 2},
                std::array<int, 4>{3, 6, 12, 24});
        shift_window_transformer::Tensor<data_t> input(3 * 224 * 224, 0);
        input.shape = {3, 224, 224};
        shift_window_transformer::Tensor<data_t> output{};
        swin_t->forward(input, output);
        delete swin_t;
        std::cout << "Ok" << std::endl;
    } catch (...) {
        std::cout << "Error" << std::endl;
    }
    return 0;
}